

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYRef<unsigned_char>,_ImPlot::TransformerLogLin>
                 *this,GetterXsYs<unsigned_char> *getter1,GetterXsYRef<unsigned_char> *getter2,
                TransformerLogLin *transformer,ImU32 col)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  GetterXsYRef<unsigned_char> *pGVar5;
  TransformerLogLin *pTVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  long lVar13;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar3 = getter1->Count;
  iVar12 = getter2->Count;
  if (iVar3 < getter2->Count) {
    iVar12 = iVar3;
  }
  this->Prims = iVar12 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar11 = GImPlot;
  (this->P12).y = 0.0;
  lVar13 = (long)((getter1->Offset % iVar3 + iVar3) % iVar3) * (long)getter1->Stride;
  bVar2 = getter1->Ys[lVar13];
  dVar9 = log10((double)getter1->Xs[lVar13] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar11->CurrentPlot;
  dVar1 = (pIVar4->XAxis).Range.Min;
  iVar3 = transformer->YAxis;
  IVar7.y = (float)(((double)bVar2 - pIVar4->YAxis[iVar3].Range.Min) * pIVar11->My[iVar3] +
                   (double)pIVar11->PixelRange[iVar3].Min.y);
  IVar7.x = (float)((((double)(float)(dVar9 / pIVar11->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar1) + dVar1) - dVar1) * pIVar11->Mx +
                   (double)pIVar11->PixelRange[iVar3].Min.x);
  this->P11 = IVar7;
  pIVar11 = GImPlot;
  pGVar5 = this->Getter2;
  pTVar6 = this->Transformer;
  iVar3 = pGVar5->Count;
  dVar1 = pGVar5->YRef;
  dVar10 = log10((double)pGVar5->Xs
                         [(long)((pGVar5->Offset % iVar3 + iVar3) % iVar3) * (long)pGVar5->Stride] /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar11->CurrentPlot;
  dVar9 = (pIVar4->XAxis).Range.Min;
  iVar3 = pTVar6->YAxis;
  IVar8.y = (float)((dVar1 - pIVar4->YAxis[iVar3].Range.Min) * pIVar11->My[iVar3] +
                   (double)pIVar11->PixelRange[iVar3].Min.y);
  IVar8.x = (float)((((double)(float)(dVar10 / pIVar11->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar9) + dVar9) - dVar9) * pIVar11->Mx +
                   (double)pIVar11->PixelRange[iVar3].Min.x);
  this->P12 = IVar8;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }